

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void prepare_vertical_filter_coeffs_avx2(int gamma,int delta,int sy,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 (*in_RCX) [32];
  int in_EDX;
  int in_ESI;
  int in_EDI;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  __m256i filt_3;
  __m256i filt_2;
  __m256i filt_1;
  __m256i filt_0;
  __m128i filt_13;
  __m128i filt_12;
  __m128i filt_11;
  __m128i filt_10;
  __m128i filt_03;
  __m128i filt_02;
  __m128i filt_01;
  __m128i filt_00;
  
  iVar17 = in_EDX + in_ESI >> 10;
  iVar18 = in_EDX + in_ESI + in_EDI * 2 >> 10;
  iVar19 = in_EDX + in_ESI + in_EDI * 4 >> 10;
  iVar20 = in_EDX + in_ESI + in_EDI * 6 >> 10;
  auVar8._16_8_ = *(undefined8 *)av1_warped_filter[iVar17];
  auVar8._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX >> 10];
  auVar8._24_8_ = *(undefined8 *)(av1_warped_filter[iVar17] + 4);
  auVar7._16_8_ = *(undefined8 *)av1_warped_filter[iVar18];
  auVar7._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 2 >> 10];
  auVar7._24_8_ = *(undefined8 *)(av1_warped_filter[iVar18] + 4);
  auVar3 = vpunpckldq_avx2(auVar8,auVar7);
  auVar6._16_8_ = *(undefined8 *)av1_warped_filter[iVar19];
  auVar6._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 4 >> 10];
  auVar6._24_8_ = *(undefined8 *)(av1_warped_filter[iVar19] + 4);
  auVar5._16_8_ = *(undefined8 *)av1_warped_filter[iVar20];
  auVar5._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 6 >> 10];
  auVar5._24_8_ = *(undefined8 *)(av1_warped_filter[iVar20] + 4);
  auVar4 = vpunpckldq_avx2(auVar6,auVar5);
  auVar16._16_8_ = *(undefined8 *)av1_warped_filter[iVar17];
  auVar16._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX >> 10];
  auVar16._24_8_ = *(undefined8 *)(av1_warped_filter[iVar17] + 4);
  auVar15._16_8_ = *(undefined8 *)av1_warped_filter[iVar18];
  auVar15._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 2 >> 10];
  auVar15._24_8_ = *(undefined8 *)(av1_warped_filter[iVar18] + 4);
  auVar1 = vpunpckhdq_avx2(auVar16,auVar15);
  auVar14._16_8_ = *(undefined8 *)av1_warped_filter[iVar19];
  auVar14._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 4 >> 10];
  auVar14._24_8_ = *(undefined8 *)(av1_warped_filter[iVar19] + 4);
  auVar13._16_8_ = *(undefined8 *)av1_warped_filter[iVar20];
  auVar13._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 6 >> 10];
  auVar13._24_8_ = *(undefined8 *)(av1_warped_filter[iVar20] + 4);
  auVar2 = vpunpckhdq_avx2(auVar14,auVar13);
  auVar5 = vpunpcklqdq_avx2(auVar3,auVar4);
  *in_RCX = auVar5;
  auVar3 = vpunpckhqdq_avx2(auVar3,auVar4);
  in_RCX[1] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
  in_RCX[2] = auVar3;
  auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
  in_RCX[3] = auVar1;
  iVar17 = in_EDX + in_ESI + in_EDI >> 10;
  iVar18 = in_EDX + in_ESI + in_EDI * 3 >> 10;
  iVar19 = in_EDX + in_ESI + in_EDI * 5 >> 10;
  iVar20 = in_EDX + in_ESI + in_EDI * 7 >> 10;
  auVar4._16_8_ = *(undefined8 *)av1_warped_filter[iVar17];
  auVar4._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI >> 10];
  auVar4._24_8_ = *(undefined8 *)(av1_warped_filter[iVar17] + 4);
  auVar3._16_8_ = *(undefined8 *)av1_warped_filter[iVar18];
  auVar3._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 3 >> 10];
  auVar3._24_8_ = *(undefined8 *)(av1_warped_filter[iVar18] + 4);
  auVar3 = vpunpckldq_avx2(auVar4,auVar3);
  auVar2._16_8_ = *(undefined8 *)av1_warped_filter[iVar19];
  auVar2._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 5 >> 10];
  auVar2._24_8_ = *(undefined8 *)(av1_warped_filter[iVar19] + 4);
  auVar1._16_8_ = *(undefined8 *)av1_warped_filter[iVar20];
  auVar1._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 7 >> 10];
  auVar1._24_8_ = *(undefined8 *)(av1_warped_filter[iVar20] + 4);
  auVar4 = vpunpckldq_avx2(auVar2,auVar1);
  auVar12._16_8_ = *(undefined8 *)av1_warped_filter[iVar17];
  auVar12._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI >> 10];
  auVar12._24_8_ = *(undefined8 *)(av1_warped_filter[iVar17] + 4);
  auVar11._16_8_ = *(undefined8 *)av1_warped_filter[iVar18];
  auVar11._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 3 >> 10];
  auVar11._24_8_ = *(undefined8 *)(av1_warped_filter[iVar18] + 4);
  auVar1 = vpunpckhdq_avx2(auVar12,auVar11);
  auVar10._16_8_ = *(undefined8 *)av1_warped_filter[iVar19];
  auVar10._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 5 >> 10];
  auVar10._24_8_ = *(undefined8 *)(av1_warped_filter[iVar19] + 4);
  auVar9._16_8_ = *(undefined8 *)av1_warped_filter[iVar20];
  auVar9._0_16_ = (undefined1  [16])av1_warped_filter[in_EDX + in_EDI * 7 >> 10];
  auVar9._24_8_ = *(undefined8 *)(av1_warped_filter[iVar20] + 4);
  auVar2 = vpunpckhdq_avx2(auVar10,auVar9);
  auVar5 = vpunpcklqdq_avx2(auVar3,auVar4);
  in_RCX[4] = auVar5;
  auVar3 = vpunpckhqdq_avx2(auVar3,auVar4);
  in_RCX[5] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
  in_RCX[6] = auVar3;
  auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
  in_RCX[7] = auVar1;
  return;
}

Assistant:

static inline void prepare_vertical_filter_coeffs_avx2(int gamma, int delta,
                                                       int sy,
                                                       __m256i *coeffs) {
  __m128i filt_00 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_01 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_02 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_03 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

  __m128i filt_10 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter +
                  (((sy + delta) + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_11 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter +
                  (((sy + delta) + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_12 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter +
                  (((sy + delta) + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_13 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter +
                  (((sy + delta) + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

  __m256i filt_0 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_00), filt_10, 0x1);
  __m256i filt_1 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_01), filt_11, 0x1);
  __m256i filt_2 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_02), filt_12, 0x1);
  __m256i filt_3 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_03), filt_13, 0x1);

  __m256i res_0 = _mm256_unpacklo_epi32(filt_0, filt_1);
  __m256i res_1 = _mm256_unpacklo_epi32(filt_2, filt_3);
  __m256i res_2 = _mm256_unpackhi_epi32(filt_0, filt_1);
  __m256i res_3 = _mm256_unpackhi_epi32(filt_2, filt_3);

  coeffs[0] = _mm256_unpacklo_epi64(res_0, res_1);
  coeffs[1] = _mm256_unpackhi_epi64(res_0, res_1);
  coeffs[2] = _mm256_unpacklo_epi64(res_2, res_3);
  coeffs[3] = _mm256_unpackhi_epi64(res_2, res_3);

  filt_00 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_01 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_02 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_03 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

  filt_10 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter +
                  (((sy + delta) + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_11 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter +
                  (((sy + delta) + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_12 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter +
                  (((sy + delta) + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_13 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter +
                  (((sy + delta) + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

  filt_0 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_00), filt_10, 0x1);
  filt_1 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_01), filt_11, 0x1);
  filt_2 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_02), filt_12, 0x1);
  filt_3 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_03), filt_13, 0x1);

  res_0 = _mm256_unpacklo_epi32(filt_0, filt_1);
  res_1 = _mm256_unpacklo_epi32(filt_2, filt_3);
  res_2 = _mm256_unpackhi_epi32(filt_0, filt_1);
  res_3 = _mm256_unpackhi_epi32(filt_2, filt_3);

  coeffs[4] = _mm256_unpacklo_epi64(res_0, res_1);
  coeffs[5] = _mm256_unpackhi_epi64(res_0, res_1);
  coeffs[6] = _mm256_unpacklo_epi64(res_2, res_3);
  coeffs[7] = _mm256_unpackhi_epi64(res_2, res_3);
}